

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCase::deinit
          (ComputeShaderGeneratedCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ComputeShaderGeneratedCase *this_local;
  
  if (this->m_cmdBufferID != 0) {
    pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_cmdBufferID);
    this->m_cmdBufferID = 0;
  }
  if (this->m_dataBufferID != 0) {
    pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))(1,&this->m_dataBufferID);
    this->m_dataBufferID = 0;
  }
  if (this->m_indexBufferID != 0) {
    pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar1) + 0x438))(1,&this->m_indexBufferID);
    this->m_indexBufferID = 0;
  }
  if (this->m_shaderProgram != (ShaderProgram *)0x0) {
    this_00 = this->m_shaderProgram;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
      operator_delete(this_00,0xd0);
    }
    this->m_shaderProgram = (ShaderProgram *)0x0;
  }
  return;
}

Assistant:

void ComputeShaderGeneratedCase::deinit (void)
{
	if (m_cmdBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_cmdBufferID);
		m_cmdBufferID = 0;
	}
	if (m_dataBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_dataBufferID);
		m_dataBufferID = 0;
	}
	if (m_indexBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_indexBufferID);
		m_indexBufferID = 0;
	}

	if (m_shaderProgram)
	{
		delete m_shaderProgram;
		m_shaderProgram = DE_NULL;
	}
}